

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_2::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *headers,int parts)

{
  size_t __n;
  uint uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  undefined4 local_30;
  uint local_2c;
  
  local_30 = 0x1312f76;
  (*os->_vptr_OStream[2])(os,&local_30,4);
  local_2c = 0x1002;
  if (parts == 1) {
    psVar4 = Header::type_abi_cxx11_(headers);
    __n = psVar4->_M_string_length;
    local_2c = 2;
    if (__n == _DAT_003db950) {
      if (__n == 0) {
        local_2c = 0x202;
      }
      else {
        iVar3 = bcmp((psVar4->_M_dataplus)._M_p,TILEDIMAGE_abi_cxx11_,__n);
        local_2c = (uint)(iVar3 == 0) << 9 | 2;
      }
    }
  }
  if (0 < parts) {
    uVar5 = (ulong)(uint)parts;
    do {
      bVar2 = usesLongNames(headers);
      uVar1 = local_2c | 0x400;
      if (!bVar2) {
        uVar1 = local_2c;
      }
      bVar2 = Header::hasType(headers);
      local_2c = uVar1;
      if (bVar2) {
        psVar4 = Header::type_abi_cxx11_(headers);
        bVar2 = isImage(psVar4);
        if (!bVar2) {
          local_2c = uVar1 | 0x800;
        }
      }
      headers = headers + 1;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  (*os->_vptr_OStream[2])(os,&local_2c,4);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header*                            headers,
    int                                      parts)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (parts == 1)
    {
        if (headers[0].type () == TILEDIMAGE) version |= TILED_FLAG;
    }
    else
    {
        version |= MULTI_PART_FILE_FLAG;
    }

    for (int i = 0; i < parts; i++)
    {
        if (usesLongNames (headers[i])) version |= LONG_NAMES_FLAG;

        if (headers[i].hasType () && isImage (headers[i].type ()) == false)
            version |= NON_IMAGE_FLAG;
    }

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}